

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_uu.c
# Opt level: O0

int uudecode_bidder_init(archive_read_filter *self)

{
  void *__ptr;
  void *__ptr_00;
  void *__ptr_01;
  void *in_buff;
  void *out_buff;
  uudecode *uudecode;
  archive_read_filter *self_local;
  
  self->code = 7;
  self->name = "uu";
  self->read = uudecode_filter_read;
  self->skip = (_func_int64_t_archive_read_filter_ptr_int64_t *)0x0;
  self->close = uudecode_filter_close;
  __ptr = calloc(0x30,1);
  __ptr_00 = malloc(0x10000);
  __ptr_01 = malloc(0x400);
  if (((__ptr == (void *)0x0) || (__ptr_00 == (void *)0x0)) || (__ptr_01 == (void *)0x0)) {
    archive_set_error(&self->archive->archive,0xc,"Can\'t allocate data for uudecode");
    free(__ptr);
    free(__ptr_00);
    free(__ptr_01);
    self_local._4_4_ = -0x1e;
  }
  else {
    self->data = __ptr;
    *(void **)((long)__ptr + 8) = __ptr_01;
    *(undefined4 *)((long)__ptr + 0x10) = 0;
    *(undefined8 *)((long)__ptr + 0x18) = 0x400;
    *(void **)((long)__ptr + 0x20) = __ptr_00;
    *(undefined4 *)((long)__ptr + 0x28) = 0;
    self_local._4_4_ = 0;
  }
  return self_local._4_4_;
}

Assistant:

static int
uudecode_bidder_init(struct archive_read_filter *self)
{
	struct uudecode   *uudecode;
	void *out_buff;
	void *in_buff;

	self->code = ARCHIVE_FILTER_UU;
	self->name = "uu";
	self->read = uudecode_filter_read;
	self->skip = NULL; /* not supported */
	self->close = uudecode_filter_close;

	uudecode = (struct uudecode *)calloc(sizeof(*uudecode), 1);
	out_buff = malloc(OUT_BUFF_SIZE);
	in_buff = malloc(IN_BUFF_SIZE);
	if (uudecode == NULL || out_buff == NULL || in_buff == NULL) {
		archive_set_error(&self->archive->archive, ENOMEM,
		    "Can't allocate data for uudecode");
		free(uudecode);
		free(out_buff);
		free(in_buff);
		return (ARCHIVE_FATAL);
	}

	self->data = uudecode;
	uudecode->in_buff = in_buff;
	uudecode->in_cnt = 0;
	uudecode->in_allocated = IN_BUFF_SIZE;
	uudecode->out_buff = out_buff;
	uudecode->state = ST_FIND_HEAD;

	return (ARCHIVE_OK);
}